

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
jessilib::json_parser::serialize_impl<char8_t,char>
          (json_parser *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_string,
          object *in_object)

{
  object *poVar1;
  int iVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  invalid_argument *this_00;
  uint *puVar5;
  char8_t *__last;
  char8_t *__first;
  object *obj;
  object *in_object_00;
  u8string_view in_string;
  u8string_view in_string_00;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_78;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_58;
  
  if ((serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::s_null_array ==
       '\0') &&
     (iVar2 = __cxa_guard_acquire(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                                   ::s_null_array), iVar2 != 0)) {
    serialize_impl<char8_t,_char>::s_null_array.
    super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    serialize_impl<char8_t,_char>::s_null_array.
    super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    serialize_impl<char8_t,_char>::s_null_array.
    super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector,
                 &serialize_impl<char8_t,_char>::s_null_array,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_array);
  }
  if ((serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
       s_null_map_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                                   ::s_null_map_abi_cxx11_), iVar2 != 0)) {
    serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
    s_null_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
    s_null_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
    s_null_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
          s_null_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
    s_null_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
          s_null_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
    s_null_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                 ::~map,&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_);
  }
  puVar5 = &switchD_001bb690::switchdataD_001c2bb8;
  switch(*(__index_type *)
          ((long)&(in_object->m_value).
                  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                  .
                  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                  .
                  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                  .
                  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                  .
                  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                  .
                  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
          + 0x30)) {
  case '\0':
    __first = "null";
    __last = "";
    goto LAB_001bb8b6;
  case '\x01':
    if ((*(byte *)&(in_object->m_value).
                   super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                   .
                   super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   .
                   super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        & 1) == 0) {
      __first = "false";
      __last = "";
    }
    else {
      __first = "true";
      __last = "";
    }
LAB_001bb8b6:
    std::__cxx11::string::append<char8_t_const*,void>((string *)out_string,__first,__last);
    return;
  case '\x02':
    local_58._M_dataplus._M_p =
         *(pointer *)
          &(in_object->m_value).
           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
           .
           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    ;
    fmt::v8::vformat_abi_cxx11_(&local_78,&empty_format_arg<char>,2,3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out_string,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
    goto LAB_001bb7ec;
  case '\x03':
    local_58._M_dataplus._M_p =
         *(pointer *)
          &(in_object->m_value).
           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
           .
           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
           .
           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
    ;
    local_58._M_string_length =
         CONCAT62(local_58._M_string_length._2_6_,
                  (short)*(undefined4 *)
                          ((long)&(in_object->m_value).
                                  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                                  .
                                  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                  .
                                  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                  .
                                  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                  .
                                  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                  .
                                  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          + 8));
    fmt::v8::vformat_abi_cxx11_(&local_78,&empty_format_arg<char>,2,0xb);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (out_string,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
LAB_001bb7ec:
    std::__cxx11::string::~string((string *)&local_78);
    break;
  case '\x04':
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    object::
    get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
              (&local_78,in_object,&local_58);
    in_string._M_str = (char8_t *)puVar5;
    in_string._M_len = (size_t)local_78._M_dataplus._M_p;
    make_json_string<char8_t,char>
              ((jessilib *)out_string,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_78._M_string_length,in_string);
    std::__cxx11::u8string::~u8string((u8string *)&local_78);
    std::__cxx11::u8string::~u8string((u8string *)&local_58);
    break;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              ((string *)&local_58,
               (long)(char)*(__index_type *)
                            ((long)&(in_object->m_value).
                                    super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                                    .
                                    super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                                    .
                                    super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                            + 0x30));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "Invalid data type: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_78);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case '\x06':
    sVar3 = object::size(in_object);
    if (sVar3 == 0) {
      std::__cxx11::string::append<char8_t_const*,void>((string *)out_string,"[]","");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (out_string,'[');
    if (*(__index_type *)
         ((long)&(in_object->m_value).
                 super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                 .
                 super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
         + 0x30) != '\x06') {
      in_object = (object *)&serialize_impl<char8_t,_char>::s_null_array;
    }
    poVar1 = *(object **)
              ((long)&(in_object->m_value).
                      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                      .
                      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                      .
                      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
              + 8);
    for (in_object_00 = *(object **)
                         &(in_object->m_value).
                          super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                          .
                          super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
        ; in_object_00 != poVar1; in_object_00 = in_object_00 + 1) {
      serialize_impl<char8_t,char>(this,out_string,in_object_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (out_string,',');
    }
    (out_string->_M_dataplus)._M_p[out_string->_M_string_length - 1] = ']';
    break;
  case '\a':
    sVar3 = object::size(in_object);
    if (sVar3 == 0) {
      std::__cxx11::string::append<char8_t_const*,void>((string *)out_string,"{}","");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (out_string,'{');
    if (*(__index_type *)
         ((long)&(in_object->m_value).
                 super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                 .
                 super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                 .
                 super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
         + 0x30) != '\a') {
      in_object = (object *)
                  &serialize_impl<char8_t,char>(std::__cxx11::string&,jessilib::object_const&)::
                   s_null_map_abi_cxx11_;
    }
    for (p_Var4 = *(_Rb_tree_node_base **)
                   ((long)&(in_object->m_value).
                           super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           .
                           super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                           .
                           super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                   + 0x18);
        p_Var4 != (_Rb_tree_node_base *)
                  ((long)&(in_object->m_value).
                          super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                          .
                          super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                          .
                          super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
                  + 8U); p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      in_string_00._M_str = (char8_t *)puVar5;
      in_string_00._M_len = *(size_t *)(p_Var4 + 1);
      make_json_string<char8_t,char>
                ((jessilib *)out_string,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 p_Var4[1]._M_parent,in_string_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (out_string,':');
      serialize_impl<char8_t,char>(this,out_string,(object *)(p_Var4 + 2));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (out_string,',');
    }
    (out_string->_M_dataplus)._M_p[out_string->_M_string_length - 1] = '}';
  }
  return;
}

Assistant:

void json_parser::serialize_impl(std::basic_string<ResultCharT>& out_string, const object& in_object) {
	using namespace std::literals;
	static const object::array_type s_null_array;
	static const object::map_type s_null_map;

	switch (in_object.type()) {
		case object::type::null:
			simple_append<CharT, ResultCharT>(out_string, u8"null"sv);
			return;

		case object::type::boolean:
			if (in_object.get<bool>()) {
				simple_append<CharT, ResultCharT>(out_string, u8"true"sv);
				return;
			}
			simple_append<CharT, ResultCharT>(out_string, u8"false"sv);
			return;

		case object::type::integer:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<intmax_t>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<intmax_t>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::decimal:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<long double>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<long double>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::text:
			make_json_string<CharT, ResultCharT>(out_string, in_object.get<std::u8string>());
			return;

		case object::type::array: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"[]"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '[');

			// Serialize all objects in array
			for (auto& obj : in_object.get<object::array_type>(s_null_array)) {
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, obj);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with ']'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = ']';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, ']');
			}
			// else // not supported
			return;
		}

		case object::type::map: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"{}"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '{');

			// Serialize all objects in map
			for (auto& item : in_object.get<object::map_type>(s_null_map)) {
				make_json_string<CharT, ResultCharT>(out_string, item.first);
				simple_append<CharT, ResultCharT>(out_string, ':');
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, item.second);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with '}'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = '}';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, '}');
			}
			// else // not supported
			return;
		}

		default:
			throw std::invalid_argument{ "Invalid data type: " + std::to_string(static_cast<size_t>(in_object.type())) };
	}
}